

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmValue __thiscall
cmGeneratorTarget::GetFileSuffixInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *language)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  cmValue cVar3;
  char *__s;
  ArtifactType artifact_00;
  string langSuffix;
  cmAlphaNum local_a8;
  string local_78;
  cmAlphaNum local_58;
  
  TVar2 = GetType(this);
  if (((((TVar2 != STATIC_LIBRARY) && (TVar2 = GetType(this), TVar2 != SHARED_LIBRARY)) &&
       (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) &&
      (TVar2 = GetType(this), TVar2 != EXECUTABLE)) ||
     ((artifact == ImportLibraryArtifact && (bVar1 = NeedImportLibraryName(this,config), !bVar1))))
  {
    return (cmValue)(string *)0x0;
  }
  TVar2 = GetType(this);
  artifact_00 = artifact;
  if ((TVar2 != SHARED_LIBRARY) && (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) {
    TVar2 = GetType(this);
    artifact_00 = RuntimeBinaryArtifact;
    if (TVar2 == EXECUTABLE) {
      artifact_00 = artifact;
    }
  }
  if (artifact == ImportLibraryArtifact) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"IMPORT_SUFFIX",(allocator<char> *)&local_58);
    cVar3 = GetProperty(this,(string *)&local_a8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"SUFFIX",(allocator<char> *)&local_58);
    cVar3 = GetProperty(this,(string *)&local_a8);
  }
  std::__cxx11::string::~string((string *)&local_a8);
  if (cVar3.Value != (string *)0x0) {
    return (cmValue)cVar3.Value;
  }
  __s = cmTarget::GetSuffixVariableInternal(this->Target,artifact_00);
  if (language->_M_string_length != 0) {
    if (__s == (char *)0x0) {
      return (cmValue)(string *)0x0;
    }
    if (*__s != '\0') {
      local_a8.View_._M_len = strlen(__s);
      local_58.View_._M_len = 1;
      local_58.View_._M_str = "_";
      local_a8.View_._M_str = __s;
      cmStrCat<std::__cxx11::string>(&local_78,&local_a8,&local_58,language);
      cVar3 = cmMakefile::GetDefinition(this->Makefile,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      goto LAB_00333178;
    }
  }
  cVar3.Value = (string *)0x0;
LAB_00333178:
  if (__s != (char *)0x0 && cVar3.Value == (string *)0x0) {
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,__s,(allocator<char> *)&local_58);
    cVar3 = cmMakefile::GetDefinition(this_00,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return (cmValue)cVar3.Value;
}

Assistant:

cmValue cmGeneratorTarget::GetFileSuffixInternal(
  std::string const& config, cmStateEnums::ArtifactType artifact,
  const std::string& language) const
{
  // no suffix for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    return nullptr;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty suffix for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact && !this->NeedImportLibraryName(config)) {
    return nullptr;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute suffix value.
  cmValue targetSuffix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_SUFFIX")
                               : this->GetProperty("SUFFIX"));

  if (!targetSuffix) {
    const char* suffixVar = this->Target->GetSuffixVariableInternal(artifact);
    if (!language.empty() && cmNonempty(suffixVar)) {
      std::string langSuffix = cmStrCat(suffixVar, "_", language);
      targetSuffix = this->Makefile->GetDefinition(langSuffix);
    }

    // if there is no suffix on the target nor specific language
    // use the cmake definition.
    if (!targetSuffix && suffixVar) {
      targetSuffix = this->Makefile->GetDefinition(suffixVar);
    }
  }

  return targetSuffix;
}